

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enummanager.cpp
# Opt level: O2

Enum * __thiscall camp::detail::EnumManager::addClass(EnumManager *this,string *name,string *id)

{
  type *this_00;
  iterator iVar1;
  iterator iVar2;
  Enum *this_01;
  EnumAlreadyCreated *__return_storage_ptr__;
  allocator local_e2;
  allocator local_e1;
  shared_ptr<camp::Enum> newEnum;
  EnumInfo info;
  EnumAlreadyCreated local_70;
  
  this_00 = &(this->m_enums).super_type;
  iVar1 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::id>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<1,camp::detail::EnumManager::EnumInfo,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::id>,mpl_::na>,boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::name>,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<camp::detail::EnumManager::EnumInfo>>,boost::mpl::v_item<camp::detail::EnumManager::Id,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<std::__cxx11::string>
                    ((ordered_index_impl<boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::id>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<1,camp::detail::EnumManager::EnumInfo,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::id>,mpl_::na>,boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::name>,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<camp::detail::EnumManager::EnumInfo>>,boost::mpl::v_item<camp::detail::EnumManager::Id,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)this_00,id);
  if (iVar1.node ==
      (this->m_enums).
      super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::EnumManager::EnumInfo,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>_>_*,_boost::multi_index::multi_index_container<camp::detail::EnumManager::EnumInfo,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::id>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>
      .member) {
    iVar2 = boost::multi_index::detail::
            ordered_index_impl<boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::name>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,camp::detail::EnumManager::EnumInfo,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::id>,mpl_::na>,boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::name>,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<camp::detail::EnumManager::EnumInfo>>,boost::mpl::v_item<camp::detail::EnumManager::Name,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
            ::find<std::__cxx11::string>
                      ((ordered_index_impl<boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::name>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,camp::detail::EnumManager::EnumInfo,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::id>,mpl_::na>,boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::name>,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<camp::detail::EnumManager::EnumInfo>>,boost::mpl::v_item<camp::detail::EnumManager::Name,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                        *)this_00,name);
    if ((ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::EnumManager::EnumInfo,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>_>
         *)iVar2.node ==
        (this->m_enums).
        super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::EnumManager::EnumInfo,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>_>_*,_boost::multi_index::multi_index_container<camp::detail::EnumManager::EnumInfo,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::id>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>
        .member) {
      this_01 = (Enum *)operator_new(0x68);
      Enum::Enum(this_01,name);
      std::__shared_ptr<camp::Enum,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<camp::Enum,void>
                ((__shared_ptr<camp::Enum,(__gnu_cxx::_Lock_policy)2> *)&newEnum,this_01);
      info.id._M_dataplus._M_p = (pointer)&info.id.field_2;
      info.id._M_string_length = 0;
      info.id.field_2._M_local_buf[0] = '\0';
      info.name._M_dataplus._M_p = (pointer)&info.name.field_2;
      info.name._M_string_length = 0;
      info.name.field_2._M_local_buf[0] = '\0';
      info.enumPtr.super___shared_ptr<camp::Enum,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      info.enumPtr.super___shared_ptr<camp::Enum,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__cxx11::string::_M_assign((string *)&info);
      std::__cxx11::string::_M_assign((string *)&info.name);
      std::__shared_ptr<camp::Enum,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&info.enumPtr.super___shared_ptr<camp::Enum,_(__gnu_cxx::_Lock_policy)2>,
                 &newEnum.super___shared_ptr<camp::Enum,_(__gnu_cxx::_Lock_policy)2>);
      boost::multi_index::
      multi_index_container<camp::detail::EnumManager::EnumInfo,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::id>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::detail::EnumManager::EnumInfo>_>
      ::insert_<boost::multi_index::detail::lvalue_tag>(&this->m_enums,&info);
      ObserverNotifier::notifyEnumAdded
                (&this->super_ObserverNotifier,
                 newEnum.super___shared_ptr<camp::Enum,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      EnumInfo::~EnumInfo(&info);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&newEnum.super___shared_ptr<camp::Enum,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return newEnum.super___shared_ptr<camp::Enum,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
  }
  __return_storage_ptr__ = (EnumAlreadyCreated *)__cxa_allocate_exception(0x48);
  EnumAlreadyCreated::EnumAlreadyCreated(&local_70,name,id);
  std::__cxx11::string::string
            ((string *)&info,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/enummanager.cpp"
             ,&local_e1);
  std::__cxx11::string::string
            ((string *)&newEnum,
             "Enum &camp::detail::EnumManager::addClass(const std::string &, const std::string &)",
             &local_e2);
  Error::prepare<camp::EnumAlreadyCreated>
            (__return_storage_ptr__,&local_70,&info.id,0x38,(string *)&newEnum);
  __cxa_throw(__return_storage_ptr__,&EnumAlreadyCreated::typeinfo,Error::~Error);
}

Assistant:

Enum& EnumManager::addClass(const std::string& name, const std::string& id)
{
    const IdIndex&   ids   = m_enums.get<Id>();
    const NameIndex& names = m_enums.get<Name>();

    // First make sure that the enum doesn't already exist
    if ((ids.find(id) != ids.end()) || (names.find(name) != names.end()))
        CAMP_ERROR(EnumAlreadyCreated(name, id));

    // Create the new class
    std::shared_ptr<Enum> newEnum(new Enum(name));

    // Insert it into the table
    EnumInfo info;
    info.id = id;
    info.name = name;
    info.enumPtr = newEnum;
    m_enums.insert(info);

    // Notify observers
    notifyEnumAdded(*newEnum);

    return *newEnum;
}